

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

string * __thiscall Board::getHash_abi_cxx11_(string *__return_storage_ptr__,Board *this)

{
  uint uVar1;
  uint __val;
  uint uVar2;
  uint uVar3;
  long *plVar4;
  long lVar5;
  ulong uVar6;
  long *plVar7;
  long lVar8;
  uint __len;
  string __str;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar5 = 0;
  do {
    lVar8 = 0;
    do {
      uVar1 = this->cells[lVar5][lVar8];
      __val = -uVar1;
      if (0 < (int)uVar1) {
        __val = uVar1;
      }
      __len = 1;
      if (9 < __val) {
        uVar6 = (ulong)__val;
        uVar2 = 4;
        do {
          __len = uVar2;
          uVar3 = (uint)uVar6;
          if (uVar3 < 100) {
            __len = __len - 2;
            goto LAB_0010716c;
          }
          if (uVar3 < 1000) {
            __len = __len - 1;
            goto LAB_0010716c;
          }
          if (uVar3 < 10000) goto LAB_0010716c;
          uVar6 = uVar6 / 10000;
          uVar2 = __len + 4;
        } while (99999 < uVar3);
        __len = __len + 1;
      }
LAB_0010716c:
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct((ulong)local_70,(char)__len - (char)((int)uVar1 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>(local_70[0] + (uVar1 >> 0x1f),__len,__val);
      plVar4 = (long *)std::__cxx11::string::replace
                                 ((ulong)local_70,0,(char *)0x0,
                                  (ulong)(__return_storage_ptr__->_M_dataplus)._M_p);
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_40 = *plVar7;
        lStack_38 = plVar4[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar7;
        local_50 = (long *)*plVar4;
      }
      local_48 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 6);
    lVar5 = lVar5 + 1;
    if (lVar5 == 6) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::string Board::getHash() {
    string hash = string();
    for (int i = 0; i < BOARD_SIZE; ++i) {
        for (int j = 0; j < BOARD_SIZE; ++j) {
            hash = hash + std::to_string(this->cells[i][j]);
        }
    }

    return hash;
}